

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::makeFCD
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar UVar1;
  uint uVar2;
  UBool UVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint uVar6;
  UChar *s;
  ulong uVar7;
  uint uVar8;
  UChar *sLimit;
  UChar *pUVar9;
  uint c;
  UChar *local_58;
  
  c = 0;
  local_58 = src;
  if (limit == (UChar *)0x0) {
    s = copyLowPrefixFromNulTerminated(this,src,(uint)(ushort)this->minLcccCP,buffer,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return s;
    }
    uVar8 = 0;
    if (src < s) {
      uVar5 = getFCD16(this,(uint)(ushort)s[-1]);
      local_58 = s + -1;
      if (uVar5 < 2) {
        local_58 = s;
      }
      uVar8 = (uint)uVar5;
    }
    limit = u_strchr_63(s,L'\0');
  }
  else {
    uVar8 = 0;
    s = src;
  }
  uVar4 = 0;
  pUVar9 = s;
LAB_00289cda:
  do {
    while (sLimit = pUVar9, sLimit == limit) {
      if (buffer == (ReorderingBuffer *)0x0) {
        return sLimit;
      }
      if (limit == s) {
        return sLimit;
      }
LAB_00289d90:
      UVar3 = ReorderingBuffer::appendZeroCC(buffer,s,sLimit,errorCode);
      if (sLimit == limit) {
        return sLimit;
      }
      if (UVar3 == '\0') {
        return sLimit;
      }
LAB_00289db6:
      pUVar9 = sLimit;
      if ((int)uVar8 < 0) {
        if (~uVar8 < (uint)(ushort)this->minDecompNoCP) {
          uVar8 = 0;
          local_58 = sLimit;
        }
        else {
          uVar5 = getFCD16FromNormData(this,~uVar8);
          uVar8 = (uint)uVar5;
          local_58 = sLimit + ((ulong)(uVar5 < 2) - 1);
        }
      }
      else {
        local_58 = sLimit + -1;
        if ((((sLimit[-1] & 0xfc00U) == 0xdc00) && (s < local_58)) &&
           ((sLimit[-2] & 0xfc00U) == 0xd800)) {
          local_58 = sLimit + -2;
          uVar5 = getFCD16FromNormData
                            (this,(uint)(ushort)sLimit[-1] + (uint)(ushort)sLimit[-2] * 0x400 +
                                  -0x35fdc00);
          uVar8 = (uint)uVar5;
        }
        if (uVar8 < 2) {
          local_58 = sLimit;
        }
      }
LAB_00289e52:
      uVar7 = 2 - (ulong)(c < 0x10000);
      s = sLimit + (uVar7 & 0xffffffff);
      uVar6 = uVar8 & 0xff;
      uVar8 = (uint)uVar4;
      if (uVar4 >> 8 < uVar6) {
        if (buffer == (ReorderingBuffer *)0x0) {
          return local_58;
        }
        ReorderingBuffer::removeSuffix
                  (buffer,(int32_t)((ulong)((long)pUVar9 - (long)local_58) >> 1));
        s = findNextFCDBoundary(this,s,limit);
        uVar8 = 0;
        decomposeShort(this,local_58,s,'\0','\0',buffer,errorCode);
        pUVar9 = s;
        local_58 = s;
        if (U_ZERO_ERROR < *errorCode) {
          return s;
        }
      }
      else {
        if ((uVar4 & 0xfe) == 0) {
          local_58 = s;
        }
        pUVar9 = s;
        if ((buffer != (ReorderingBuffer *)0x0) &&
           (UVar3 = ReorderingBuffer::appendZeroCC(buffer,c,errorCode), UVar3 == '\0')) {
          return sLimit + uVar7;
        }
      }
    }
    UVar1 = *sLimit;
    c = (uint)(ushort)UVar1;
    uVar6 = (uint)(ushort)UVar1;
    if ((ushort)UVar1 < (ushort)this->minLcccCP) {
      uVar2 = ~uVar6;
    }
    else {
      UVar3 = singleLeadMightHaveNonZeroFCD16(this,uVar6);
      uVar2 = 0;
      if (UVar3 != '\0') {
        if ((((uVar6 & 0xfc00) == 0xd800) && (sLimit + 1 != limit)) &&
           (uVar6 = (uint)(ushort)sLimit[1], (uVar6 & 0xfc00) == 0xdc00)) {
          c = (uint)(ushort)UVar1 * 0x400 + uVar6 + 0xfca02400;
        }
        uVar4 = getFCD16FromNormData(this,c);
        if (0xff < uVar4) {
          pUVar9 = s;
          if (sLimit != s) {
            if (buffer != (ReorderingBuffer *)0x0) goto LAB_00289d90;
            goto LAB_00289db6;
          }
          goto LAB_00289e52;
        }
        uVar8 = (uint)uVar4;
        pUVar9 = sLimit + (2 - (c < 0x10000));
        goto LAB_00289cda;
      }
    }
    uVar8 = uVar2;
    pUVar9 = sLimit + 1;
  } while( true );
}

Assistant:

const UChar *
Normalizer2Impl::makeFCD(const UChar *src, const UChar *limit,
                         ReorderingBuffer *buffer,
                         UErrorCode &errorCode) const {
    // Tracks the last FCD-safe boundary, before lccc=0 or after properly-ordered tccc<=1.
    // Similar to the prevBoundary in the compose() implementation.
    const UChar *prevBoundary=src;
    int32_t prevFCD16=0;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minLcccCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        if(prevBoundary<src) {
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            // Fetching the fcd16 value was deferred for this below-U+0300 code point.
            prevFCD16=getFCD16(*(src-1));
            if(prevFCD16>1) {
                --prevBoundary;
            }
        }
        limit=u_strchr(src, 0);
    }

    // Note: In this function we use buffer->appendZeroCC() because we track
    // the lead and trail combining classes here, rather than leaving it to
    // the ReorderingBuffer.
    // The exception is the call to decomposeShort() which uses the buffer
    // in the normal way.

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t fcd16=0;

    for(;;) {
        // count code units with lccc==0
        for(prevSrc=src; src!=limit;) {
            if((c=*src)<minLcccCP) {
                prevFCD16=~c;
                ++src;
            } else if(!singleLeadMightHaveNonZeroFCD16(c)) {
                prevFCD16=0;
                ++src;
            } else {
                if(U16_IS_LEAD(c)) {
                    UChar c2;
                    if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                    }
                }
                if((fcd16=getFCD16FromNormData(c))<=0xff) {
                    prevFCD16=fcd16;
                    src+=U16_LENGTH(c);
                } else {
                    break;
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL && !buffer->appendZeroCC(prevSrc, src, errorCode)) {
                break;
            }
            if(src==limit) {
                break;
            }
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            if(prevFCD16<0) {
                // Fetching the fcd16 value was deferred for this below-minLcccCP code point.
                UChar32 prev=~prevFCD16;
                if(prev<minDecompNoCP) {
                    prevFCD16=0;
                } else {
                    prevFCD16=getFCD16FromNormData(prev);
                    if(prevFCD16>1) {
                        --prevBoundary;
                    }
                }
            } else {
                const UChar *p=src-1;
                if(U16_IS_TRAIL(*p) && prevSrc<p && U16_IS_LEAD(*(p-1))) {
                    --p;
                    // Need to fetch the previous character's FCD value because
                    // prevFCD16 was just for the trail surrogate code point.
                    prevFCD16=getFCD16FromNormData(U16_GET_SUPPLEMENTARY(p[0], p[1]));
                    // Still known to have lccc==0 because its lead surrogate unit had lccc==0.
                }
                if(prevFCD16>1) {
                    prevBoundary=p;
                }
            }
            // The start of the current character (c).
            prevSrc=src;
        } else if(src==limit) {
            break;
        }

        src+=U16_LENGTH(c);
        // The current character (c) at [prevSrc..src[ has a non-zero lead combining class.
        // Check for proper order, and decompose locally if necessary.
        if((prevFCD16&0xff)<=(fcd16>>8)) {
            // proper order: prev tccc <= current lccc
            if((fcd16&0xff)<=1) {
                prevBoundary=src;
            }
            if(buffer!=NULL && !buffer->appendZeroCC(c, errorCode)) {
                break;
            }
            prevFCD16=fcd16;
            continue;
        } else if(buffer==NULL) {
            return prevBoundary;  // quick check "no"
        } else {
            /*
             * Back out the part of the source that we copied or appended
             * already but is now going to be decomposed.
             * prevSrc is set to after what was copied/appended.
             */
            buffer->removeSuffix((int32_t)(prevSrc-prevBoundary));
            /*
             * Find the part of the source that needs to be decomposed,
             * up to the next safe boundary.
             */
            src=findNextFCDBoundary(src, limit);
            /*
             * The source text does not fulfill the conditions for FCD.
             * Decompose and reorder a limited piece of the text.
             */
            decomposeShort(prevBoundary, src, FALSE, FALSE, *buffer, errorCode);
            if (U_FAILURE(errorCode)) {
                break;
            }
            prevBoundary=src;
            prevFCD16=0;
        }
    }
    return src;
}